

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void do_nonatomic_op_i32(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 addr,TCGv_i32 val,
                        TCGArg idx,MemOp memop,_Bool new_val,
                        _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict9 *gen)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i32 val_00;
  TCGv_i32 val_01;
  
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  ts_00 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  switch(memop & MO_64) {
  case MO_8:
    memop = memop & ~MO_BE;
    break;
  case MO_32:
    memop = memop & ~MO_ASHIFT;
    break;
  case MO_64:
    do_nonatomic_op_i32_cold_1();
  }
  val_00 = (TCGv_i32)((long)ts_00 - (long)tcg_ctx);
  val_01 = (TCGv_i32)((long)ts - (long)tcg_ctx);
  tcg_gen_qemu_ld_i32_tricore(tcg_ctx,val_01,addr,idx,memop & ~MO_ASHIFT);
  (*gen)(tcg_ctx,val_00,val_01,val);
  tcg_gen_qemu_st_i32_tricore(tcg_ctx,val_00,addr,idx,memop);
  if (new_val) {
    val_01 = val_00;
  }
  tcg_gen_ext_i32(tcg_ctx,ret,val_01,memop);
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  tcg_temp_free_internal_tricore(tcg_ctx,ts_00);
  return;
}

Assistant:

static void do_nonatomic_op_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv addr, TCGv_i32 val,
                                TCGArg idx, MemOp memop, bool new_val,
                                void (*gen)(TCGContext *tcg_ctx, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);

    memop = tcg_canonicalize_memop(memop, 0, 0);

    tcg_gen_qemu_ld_i32(tcg_ctx, t1, addr, idx, memop & ~MO_SIGN);
    gen(tcg_ctx, t2, t1, val);
    tcg_gen_qemu_st_i32(tcg_ctx, t2, addr, idx, memop);

    tcg_gen_ext_i32(tcg_ctx, ret, (new_val ? t2 : t1), memop);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
}